

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall UI::renderSeparator(UI *this,char *prefix,char *ch,char *suffix,int n,bool disabled)

{
  undefined8 in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  int in_R8D;
  byte in_R9B;
  int i;
  int local_2c;
  int local_24;
  
  local_24 = in_R8D;
  if (0xff < in_R8D) {
    local_24 = 0xff;
  }
  if (local_24 < 0) {
    local_24 = 0;
  }
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    renderSeparator::buf[local_2c] = *in_RDX;
  }
  renderSeparator::buf[local_24] = '\0';
  if ((in_R9B & 1) == 0) {
    ImGui::Text("%s%s%s",in_RSI,renderSeparator::buf,in_RCX);
  }
  else {
    ImGui::TextDisabled("%s%s%s",in_RSI,renderSeparator::buf,in_RCX);
  }
  return;
}

Assistant:

void UI::renderSeparator(const char * prefix, const char * ch, const char * suffix, int n, bool disabled) {
    static char buf[256];
    if (n > 255) n = 255;
    if (n < 0) n = 0;
    for (int i = 0; i < n; i++) {
        buf[i] = ch[0];
    }
    buf[n] = 0;
    if (disabled) {
        ImGui::TextDisabled("%s%s%s", prefix, buf, suffix);
    } else {
        ImGui::Text("%s%s%s", prefix, buf, suffix);
    }
}